

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O3

void pnga_sprs_array_add_element(Integer s_a,Integer idx,Integer jdx,void *val)

{
  long lVar1;
  size_t __n;
  void *pvVar2;
  Integer *pIVar3;
  _sparse_array *p_Var4;
  Integer *pIVar5;
  Integer *pIVar6;
  void *pvVar7;
  _sparse_array *p_Var8;
  long icode;
  size_t __size;
  long lVar9;
  long lVar10;
  Integer *__ptr;
  
  icode = s_a + 1000;
  lVar1 = SPA[icode].nval;
  __n = SPA[icode].size;
  if (SPA[icode].active == 0) {
    pnga_error("(ga_sprs_array_add_element) Array not active",icode);
  }
  if (SPA[icode].ready != 0) {
    pnga_error("(ga_sprs_array_add_element) Array is already distributed",icode);
  }
  p_Var8 = SPA;
  if (SPA[icode].maxval <= lVar1) {
    pvVar2 = SPA[icode].val;
    pnga_pgroup_nodeid(SPA[icode].grp);
    p_Var4 = SPA;
    p_Var8 = SPA + icode;
    lVar9 = SPA[icode].maxval;
    __size = lVar9 << 4;
    pIVar5 = (Integer *)malloc(__size);
    pIVar6 = (Integer *)malloc(__size);
    pvVar7 = malloc(lVar9 * p_Var4[icode].size * 2);
    if (lVar1 < 1) {
      __ptr = p_Var8->idx;
    }
    else {
      __ptr = p_Var8->idx;
      pIVar3 = p_Var4[icode].jdx;
      lVar9 = 0;
      lVar10 = 0;
      do {
        pIVar5[lVar10] = __ptr[lVar10];
        pIVar6[lVar10] = pIVar3[lVar10];
        memcpy((void *)((long)pvVar7 + lVar9),(void *)((long)pvVar2 + lVar9),__n);
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + __n;
      } while (lVar1 != lVar10);
    }
    free(__ptr);
    free(SPA[icode].jdx);
    free(SPA[icode].val);
    SPA[icode].idx = pIVar5;
    SPA[icode].jdx = pIVar6;
    SPA[icode].val = pvVar7;
    p_Var8 = SPA;
    SPA[icode].maxval = SPA[icode].maxval << 1;
  }
  p_Var8[icode].idx[lVar1] = idx;
  p_Var8[icode].jdx[lVar1] = jdx;
  memcpy((void *)(lVar1 * __n + (long)p_Var8[icode].val),val,__n);
  SPA[icode].nval = SPA[icode].nval + 1;
  return;
}

Assistant:

void pnga_sprs_array_add_element(Integer s_a, Integer idx, Integer jdx, void *val)
{
  Integer hdl = GA_OFFSET + s_a;
  Integer nval = SPA[hdl].nval;
  Integer size = SPA[hdl].size;
  Integer idx_size = sizeof(Integer);
  /* Check to see if array is active and not ready */
  if (!SPA[hdl].active) 
    pnga_error("(ga_sprs_array_add_element) Array not active",hdl);
  if (SPA[hdl].ready) 
    pnga_error("(ga_sprs_array_add_element) Array is already distributed",hdl);
  /* Check to see if existing buffers can hold another value. If not, then
   * create new buffers that are twice as large and copy old data to new
   * buffers*/
  if (nval >= SPA[hdl].maxval) {
    Integer i;
    Integer *tidx;
    Integer *tjdx;
    char *tval;
    char *oval = (char*)SPA[hdl].val;
    Integer me = pnga_pgroup_nodeid(SPA[hdl].grp);

    tidx = (Integer*)malloc(2*SPA[hdl].maxval*sizeof(Integer));
    tjdx = (Integer*)malloc(2*SPA[hdl].maxval*sizeof(Integer));
    tval = (char*)malloc(2*SPA[hdl].maxval*SPA[hdl].size);
    /* copy data in old arrays to new, larger array */
    for (i=0; i<nval; i++) {
      tidx[i] = SPA[hdl].idx[i];
      tjdx[i] = SPA[hdl].jdx[i];
      memcpy((tval+i*size),(oval+i*size),(size_t)size);
    }
    /* get rid of old arrays */
    free(SPA[hdl].idx);
    free(SPA[hdl].jdx);
    free(SPA[hdl].val);
    /* re-assign local buffers */
    SPA[hdl].idx = tidx;
    SPA[hdl].jdx = tjdx;
    SPA[hdl].val = tval;
    /* add new values */
    SPA[hdl].maxval = 2*SPA[hdl].maxval;
  }
  /* add new value to buffers */
  SPA[hdl].idx[nval] = idx;
  SPA[hdl].jdx[nval] = jdx;
  memcpy((char*)SPA[hdl].val+size*nval,(char*)val,(size_t)size);
  SPA[hdl].nval++;
}